

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

void wasm::SimplifyLocals<true,_false,_true>::doNoteIfTrue
               (SimplifyLocals<true,_false,_true> *self,Expression **currp)

{
  if ((*currp)->_id != IfId) {
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,"T *wasm::Expression::cast() [T = wasm::If]");
  }
  if (*(long *)(*currp + 2) != 0) {
    std::
    vector<std::map<unsigned_int,wasm::SimplifyLocals<true,false,true>::SinkableInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>,std::allocator<std::map<unsigned_int,wasm::SimplifyLocals<true,false,true>::SinkableInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>>>
    ::
    emplace_back<std::map<unsigned_int,wasm::SimplifyLocals<true,false,true>::SinkableInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>>
              ((vector<std::map<unsigned_int,wasm::SimplifyLocals<true,false,true>::SinkableInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>,std::allocator<std::map<unsigned_int,wasm::SimplifyLocals<true,false,true>::SinkableInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>>>
                *)&self->ifStack,&self->sinkables);
    return;
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>
  ::clear(&(self->sinkables)._M_t);
  return;
}

Assistant:

static void
  doNoteIfTrue(SimplifyLocals<allowTee, allowStructure, allowNesting>* self,
               Expression** currp) {
    auto* iff = (*currp)->cast<If>();
    if (iff->ifFalse) {
      // We processed the ifTrue side of this if-else, save it on the stack.
      self->ifStack.push_back(std::move(self->sinkables));
    } else {
      // This is an if without an else.
      if (allowStructure) {
        self->optimizeIfReturn(iff, currp);
      }
      self->sinkables.clear();
    }
  }